

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::StmtScopeVisitor::handle_stmt(StmtScopeVisitor *this,Stmt *stmt)

{
  bool bVar1;
  const_iterator cVar2;
  mapped_type *__in;
  iterator iVar3;
  mapped_type *ppSVar4;
  mapped_type scope;
  VarStmt *pVVar5;
  const_iterator cVar6;
  _Base_ptr p_Var7;
  InternalException *this_00;
  _Rb_tree_node_base *p_Var8;
  undefined1 local_e0 [8];
  Scope<std::nullptr_t> *stmt_scope;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  __node_base local_c0;
  size_type sStack_b8;
  float local_b0;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint32_t local_78;
  map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *local_70;
  undefined1 local_68 [8];
  string filename;
  Stmt *parent_stmt;
  _Alloc_hider _Stack_38;
  uint32_t ln;
  Stmt *stmt_local;
  
  local_68 = (undefined1  [8])&filename._M_string_length;
  filename._M_dataplus._M_p = (pointer)0x0;
  filename._M_string_length._0_1_ = 0;
  parent_stmt._4_4_ = 0;
  _Stack_38._M_p = (pointer)stmt;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"debug-ignore",
             (allocator<char> *)(filename.field_2._M_local_buf + 8));
  bVar1 = IRNode::has_attribute(&stmt->super_IRNode,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  if (!bVar1) {
    cVar2 = std::
            _Rb_tree<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::find((_Rb_tree<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    *)this->stmt_fn_ln_,(key_type *)&stack0xffffffffffffffc8);
    if (cVar2._M_node != (_Base_ptr)(this->stmt_fn_ln_ + 8)) {
      __in = std::
             map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::at(this->stmt_fn_ln_,(key_type *)&stack0xffffffffffffffc8);
      local_e0 = (undefined1  [8])((long)&parent_stmt + 4);
      stmt_scope = (Scope<std::nullptr_t> *)local_68;
      std::tuple<std::__cxx11::string&,unsigned_int&>::operator=
                ((tuple<std::__cxx11::string&,unsigned_int&> *)local_e0,__in);
    }
    filename.field_2._8_8_ = (**(code **)(*(long *)_Stack_38._M_p + 0x20))();
    if (*(int *)(filename.field_2._8_8_ + 0x48) == 0) {
      scope = hgdb::json::Scope<hgdb::json::Module>::
              create_scope<hgdb::json::Scope<decltype(nullptr)>>
                        (&this->module_->super_Scope<hgdb::json::Module>);
      filename.field_2._8_8_ = scope;
      if (filename._M_dataplus._M_p == (pointer)0x0) {
        local_70 = this->stmt_fn_ln_;
        local_d0._M_allocated_capacity = (size_type)&p_Stack_a0;
        stmt_scope = (Scope<std::nullptr_t> *)((ulong)stmt_scope & 0xffffffff00000000);
        local_d0._8_8_ = 1;
        local_c0._M_nxt = (_Hash_node_base *)0x0;
        sStack_b8 = 0;
        local_b0 = 1.0;
        local_a8 = 0;
        p_Stack_a0 = (__node_base_ptr)0x0;
        local_e0 = (undefined1  [8])&PTR_visit_root_002c9580;
        local_98._M_p = (pointer)&local_88;
        local_90 = 0;
        local_88._M_local_buf[0] = '\0';
        local_78 = 0;
        IRVisitor::visit_root((IRVisitor *)local_e0,(IRNode *)_Stack_38._M_p);
        std::__cxx11::string::_M_assign((string *)local_68);
        parent_stmt._4_4_ = local_78;
        StmtFileNameVisitor::~StmtFileNameVisitor((StmtFileNameVisitor *)local_e0);
      }
      std::__cxx11::string::_M_assign((string *)&scope->filename);
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->stmt_scope_mapping_,&stack0xffffffffffffffc8,
                 (undefined1 *)((long)&filename.field_2 + 8));
      if (*(StatementType *)(_Stack_38._M_p + 0x78) != Assign) goto LAB_001d54fb;
    }
    else {
      iVar3 = std::
              _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->stmt_scope_mapping_)._M_h,(key_type *)((long)&filename.field_2 + 8));
      if (iVar3.
          super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_e0,"Scope not properly created",
                   (allocator<char> *)((long)&parent_stmt + 3));
        InternalException::InternalException(this_00,(string *)local_e0);
        __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      ppSVar4 = std::__detail::
                _Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->stmt_scope_mapping_,(key_type *)((long)&filename.field_2 + 8));
      scope = *ppSVar4;
    }
    p_Var8 = (_Rb_tree_node_base *)(_Stack_38._M_p + 0x98);
    for (p_Var7 = *(_Base_ptr *)(_Stack_38._M_p + 0xa8); p_Var7 != p_Var8;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      pVVar5 = add_variable<true>(this,scope,(string *)(p_Var7 + 1),(string *)&p_Var7[2]._M_parent,
                                  SUB41(p_Var7[2]._M_color,0));
      if (pVVar5 != (VarStmt *)0x0) {
        cVar6 = std::
                _Hashtable<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this->enable_conditions_->_M_h,(key_type *)&stack0xffffffffffffffc8);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          std::__detail::
          _Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<const_kratos::Stmt_*,_std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Stmt_*>,_std::hash<const_kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)this->enable_conditions_,(key_type *)&stack0xffffffffffffffc8);
          std::__cxx11::string::_M_assign
                    ((string *)&(pVVar5->super_Scope<hgdb::json::VarStmt>).condition);
        }
      }
    }
    local_e0 = (undefined1  [8])
               add_stmt(this,scope,(Stmt *)_Stack_38._M_p,(string *)local_68,parent_stmt._4_4_);
    if (local_e0 != (undefined1  [8])0x0) {
      std::
      _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->stmt_scope_mapping_,&stack0xffffffffffffffc8,local_e0);
    }
  }
LAB_001d54fb:
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void handle_stmt(Stmt *stmt) {
        std::string filename;
        uint32_t ln = 0;

        if (stmt->has_attribute("debug-ignore")) return;

        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }

        using namespace hgdb::json;
        auto *parent = stmt->parent();
        hgdb::json::Scope<> *parent_scope;
        if (parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            // this is top level
            auto *scope = module_.create_scope<Scope<>>();
            if (filename.empty()) {
                StmtFileNameVisitor v(stmt_fn_ln_);
                v.visit_root(stmt);
                filename = v.filename;
                ln = v.ln;
            }
            scope->filename = filename;
            parent_scope = scope;
            stmt_scope_mapping_.emplace(stmt, scope);

            if (stmt->type() != StatementType::Assign) {
                // only top level assign, i.e. continuous assignment can
                // have useful scope
                return;
            }

        } else {
            auto *parent_stmt = reinterpret_cast<Stmt *>(parent);
            if (stmt_scope_mapping_.find(parent_stmt) == stmt_scope_mapping_.end()) {
                throw InternalException("Scope not properly created");
            }
            parent_scope = stmt_scope_mapping_.at(parent_stmt);
        }

        // store all the context variables
        // TODO: use stack address as a way to determine the actual scope
        //  for now we flatten everything
        for (auto const &[name, value_pair] : stmt->scope_context()) {
            auto const &[rtl, value] = value_pair;
            // we don't put line number down for static variables
            // since we can't obtain them from Python
            auto *var_stmt = add_variable<true>(parent_scope, name, value, rtl);
            if (var_stmt && enable_conditions_.find(stmt) != enable_conditions_.end()) {
                var_stmt->condition = enable_conditions_.at(stmt);
            }
        }
        // add itself
        auto *stmt_scope = add_stmt(parent_scope, stmt, filename, ln);
        if (stmt_scope) {
            stmt_scope_mapping_.emplace(stmt, stmt_scope);
        }
    }